

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::Electromagnetic_Emission_PDU
          (Electromagnetic_Emission_PDU *this,EntityIdentifier *EmittingID,EntityIdentifier *EventID
          ,StateUpdateIndicator SUI,
          vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
          *EmissionSystems)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
  *EmissionSystems_local;
  StateUpdateIndicator SUI_local;
  EntityIdentifier *EventID_local;
  EntityIdentifier *EmittingID_local;
  Electromagnetic_Emission_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Electromagnetic_Emission_PDU_00338b78;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EmittingEntityID,EmittingID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID,EventID);
  EmissionSystems_local._4_1_ = (KUINT8)SUI;
  this->m_ui8StateUpdateIndicator = EmissionSystems_local._4_1_;
  sVar1 = std::
          vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
          ::size(EmissionSystems);
  this->m_ui8NumberOfEmissionSystems = (KUINT8)sVar1;
  this->m_ui16Padding = 0;
  std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
  vector(&this->m_vEmissionSystem,EmissionSystems);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui8PDUType = '\x17';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Electromagnetic_Emission_PDU::Electromagnetic_Emission_PDU( const EntityIdentifier & EmittingID, const EntityIdentifier & EventID,
        StateUpdateIndicator SUI, const vector<EmissionSystem> & EmissionSystems ) :
    m_EmittingEntityID( EmittingID ),
    m_EventID( EventID ),
    m_ui8StateUpdateIndicator( SUI ),
    m_ui8NumberOfEmissionSystems( EmissionSystems.size() ),
    m_ui16Padding( 0 ),
    m_vEmissionSystem( EmissionSystems )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = Electromagnetic_Emission_PDU_Type;
    m_ui16PDULength = ELECTROMAGNETIC_EMISSION_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}